

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t exr_attr_set_m44d(exr_context_t ctxt,int part_index,char *name,exr_attr_m44d_t *val)

{
  pthread_mutex_t *__mutex;
  exr_result_t eVar1;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  exr_context_t nonc;
  char *pcVar3;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_38;
  
  local_38 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar1;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar1 = 0x15;
LAB_00122b38:
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar1);
    return eVar1;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar1 = 8;
    goto LAB_00122b38;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar1 = exr_attr_list_find_by_name(ctxt,list,name,&local_38);
  if (eVar1 == 0) {
    eVar1 = 0;
    if (local_38->type == EXR_ATTR_M44D) goto LAB_00122bbb;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pcVar3 = local_38->type_name;
    pcVar2 = "\'%s\' requested type \'m44d\', but stored attributes is type \'%s\'";
    eVar1 = 0x10;
LAB_00122c27:
    eVar1 = (*ctxt->print_error)(ctxt,eVar1,pcVar2,name,pcVar3);
  }
  else {
    if (eVar1 == 0xf) {
      if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return 0xf;
      }
      eVar1 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_M44D,0,(uint8_t **)0x0,&local_38);
LAB_00122bbb:
      if (val == (exr_attr_m44d_t *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pcVar2 = "No input value for setting \'%s\', type \'%s\'";
        pcVar3 = "m44d";
        eVar1 = 3;
        goto LAB_00122c27;
      }
      if (eVar1 == 0) {
        memcpy((local_38->field_6).box2i,val,0x80);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_m44d (
    exr_context_t          ctxt,
    int                    part_index,
    const char*            name,
    const exr_attr_m44d_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_M44D, m44d);
}